

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O1

int hash_byte_sequence(uint8_t *bytes,size_t bytes_len,uint8_t alg_suite_id,uchar **hash_result)

{
  int iVar1;
  uchar *puVar2;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  SHA256_CTX ctx;
  SHA256_CTX SStack_98;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = -6;
  if ((int)CONCAT71(in_register_00000011,alg_suite_id) == 1) {
    puVar2 = (uchar *)lrtr_malloc(0x20);
    *hash_result = puVar2;
    if (puVar2 == (uchar *)0x0) {
      iVar1 = -1;
    }
    else {
      SHA256_Init(&SStack_98);
      SHA256_Update(&SStack_98,bytes,bytes_len);
      SHA256_Final(*hash_result,&SStack_98);
      iVar1 = -(uint)(*hash_result == (uchar *)0x0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int hash_byte_sequence(uint8_t *bytes, size_t bytes_len, uint8_t alg_suite_id, unsigned char **hash_result)
{
	if (alg_suite_id == RTR_BGPSEC_ALGORITHM_SUITE_1) {
		SHA256_CTX ctx;

		*hash_result = lrtr_malloc(SHA256_DIGEST_LENGTH);
		if (!*hash_result)
			return RTR_BGPSEC_ERROR;

		SHA256_Init(&ctx);
		SHA256_Update(&ctx, (const unsigned char *)bytes, bytes_len);
		SHA256_Final(*hash_result, &ctx);

		if (!*hash_result)
			return RTR_BGPSEC_ERROR;
	} else {
		return RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;
	}

	return RTR_BGPSEC_SUCCESS;
}